

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O1

void RunningLights(byte red,byte green,byte blue,int WaveDelay)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  int i;
  int ledIndex;
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  RGB local_5b;
  __useconds_t local_58;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = (double)(int)CONCAT71(in_register_00000039,red);
  local_40 = (double)(int)CONCAT71(in_register_00000031,green);
  local_48 = (double)(int)CONCAT71(in_register_00000011,blue);
  local_58 = WaveDelay * 1000;
  local_54 = 0;
  iVar1 = 1;
  do {
    local_54 = local_54 + 1;
    ledIndex = 0;
    do {
      local_50 = (double)(ledIndex + iVar1);
      dVar2 = sin(local_50);
      dVar2 = ((dVar2 * 127.0 + 128.0) / 255.0) * local_38;
      dVar3 = sin(local_50);
      dVar3 = ((dVar3 * 127.0 + 128.0) / 255.0) * local_40;
      dVar4 = sin(local_50);
      local_5b._r = (uchar)(int)dVar2;
      local_5b._g = (uchar)(int)dVar3;
      local_5b._b = (uchar)(int)(((dVar4 * 127.0 + 128.0) / 255.0) * local_48);
      WS2812B::Led::setColor(&leds,&local_5b,ledIndex);
      ledIndex = ledIndex + 1;
    } while (ledIndex != 0x18);
    WS2812B::Led::show(&leds);
    usleep(local_58);
    iVar1 = iVar1 + 1;
  } while (local_54 != 0x30);
  return;
}

Assistant:

void RunningLights(byte red, byte green, byte blue, int WaveDelay) {
    int Position=0;

    for(int j=0; j<NUM_LEDS*2; j++)
    {
        Position++;
        for(int i=0; i<NUM_LEDS; i++) {
            setPixel(i,((sin(i+Position) * 127 + 128)/255)*red,
                     ((sin(i+Position) * 127 + 128)/255)*green,
                     ((sin(i+Position) * 127 + 128)/255)*blue);
        }

        showStrip();
        delay(WaveDelay);
    }
}